

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawColumnRt1AddClampPalCommand::Execute
          (DrawColumnRt1AddClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  byte *pbVar12;
  int iVar13;
  
  iVar1 = (this->super_PalRtCommand).yl;
  iVar7 = ((this->super_PalRtCommand).yh - iVar1) + 1;
  iVar13 = thread->pass_end_y - iVar1;
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  if (iVar7 < iVar13) {
    iVar13 = iVar7;
  }
  uVar8 = thread->pass_start_y - iVar1;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  iVar7 = thread->num_cores;
  iVar9 = (iVar7 - (int)((iVar1 + uVar8) - thread->core) % iVar7) % iVar7;
  iVar13 = (int)((~uVar8 + iVar7 + iVar13) - iVar9) / iVar7;
  if (0 < iVar13) {
    puVar3 = (this->super_PalRtCommand)._colormap;
    puVar4 = (this->super_PalRtCommand)._srcblend;
    iVar9 = iVar1 + uVar8 + iVar9;
    pbVar12 = (this->super_PalRtCommand)._destorg +
              (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar9];
    puVar5 = (this->super_PalRtCommand)._destblend;
    iVar1 = *(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc;
    puVar6 = thread->dc_temp;
    iVar2 = (this->super_PalRtCommand)._pitch;
    lVar11 = 0;
    do {
      uVar10 = puVar5[*pbVar12] +
               puVar4[puVar3[puVar6[lVar11 * 4 + (long)((iVar9 / iVar7) * 4 + iVar1)]]];
      uVar8 = uVar10 & 0x40100400;
      uVar8 = uVar8 - (uVar8 >> 5) | uVar10 & 0x3e0f83e0 | 0x1f07c1f;
      *pbVar12 = RGB32k.All[uVar8 >> 0xf & uVar8];
      pbVar12 = pbVar12 + (long)iVar2 * (long)iVar7;
      lVar11 = lVar11 + 1;
    } while (iVar13 != (int)lVar11);
  }
  return;
}

Assistant:

void DrawColumnRt1AddClampPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4 + hx];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		do {
			uint32_t a = fg2rgb[colormap[*source]] + bg2rgb[*dest];
			uint32_t b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			*dest = RGB32k.All[(a>>15) & a];
			source += 4;
			dest += pitch;
		} while (--count);
	}